

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTupleTo<std::tuple<void(*)(short_const*,int*,int),void(*)(int_const*,unsigned_char*,int),unsigned_char,aom_bit_depth,int,void(*)(short_const*,int*,int)>,4ul>
               (undefined8 param_1,ostream *param_2)

{
  ostream *in_stack_ffffffffffffffd8;
  aom_bit_depth *in_stack_ffffffffffffffe0;
  
  PrintTupleTo<std::tuple<void(*)(short_const*,int*,int),void(*)(int_const*,unsigned_char*,int),unsigned_char,aom_bit_depth,int,void(*)(short_const*,int*,int)>,3ul>
            (param_1,param_2);
  std::operator<<(param_2,", ");
  std::
  get<3ul,void(*)(short_const*,int*,int),void(*)(int_const*,unsigned_char*,int),unsigned_char,aom_bit_depth,int,void(*)(short_const*,int*,int)>
            ((tuple<void_(*)(const_short_*,_int_*,_int),_void_(*)(const_int_*,_unsigned_char_*,_int),_unsigned_char,_aom_bit_depth,_int,_void_(*)(const_short_*,_int_*,_int)>
              *)0xb6c358);
  UniversalPrinter<aom_bit_depth>::Print(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}